

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_bitswap(DisasContext_conflict6 *ctx,int opc,int rd,int rt)

{
  long lVar1;
  TCGTemp *a1;
  TCGArg a2;
  TCGOpcode opc_00;
  code *func;
  uintptr_t o_1;
  long lVar2;
  TCGTemp *local_30;
  
  if (rd == 0) {
    return;
  }
  a1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  lVar2 = (long)a1 - (long)ctx;
  if (rt == 0) {
    opc_00 = INDEX_op_movi_i64;
    a2 = 0;
LAB_00991c89:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,opc_00,(TCGArg)a1,a2);
  }
  else if (*(long *)(&ctx[0xf9].gi + (long)rt * 2) != lVar2) {
    a2 = (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2);
    opc_00 = INDEX_op_mov_i64;
    goto LAB_00991c89;
  }
  if (opc == 0x7c000024) {
    lVar1 = *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
    func = helper_dbitswap_mips64el;
  }
  else {
    if (opc != 0x7c000020) goto LAB_00991cef;
    lVar1 = *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
    func = helper_bitswap_mips64el;
  }
  local_30 = (TCGTemp *)((long)ctx + lVar2);
  tcg_gen_callN_mips64el
            ((TCGContext_conflict6 *)ctx,func,(TCGTemp *)((long)&(ctx->base).tb + lVar1),1,&local_30
            );
LAB_00991cef:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(lVar2 + (long)ctx));
  return;
}

Assistant:

static void gen_bitswap(DisasContext *ctx, int opc, int rd, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    switch (opc) {
    case OPC_BITSWAP:
        gen_helper_bitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DBITSWAP:
        gen_helper_dbitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}